

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O2

unique_ptr<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>_>
MCTS::compute_tree<ConnectFourState>
          (ConnectFourState *root_state,ComputeOptions options,result_type initial_seed)

{
  bool bVar1;
  Node<ConnectFourState> *this;
  Node<ConnectFourState> *this_00;
  runtime_error *this_01;
  result_type in_RDX;
  int iVar2;
  double dVar3;
  Move move;
  ConnectFourState state;
  mt19937_64 random_engine;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&random_engine,in_RDX);
  if ((options.max_iterations < 0) && (options.max_time < 0.0)) {
    assertion_failed("options.max_iterations >= 0 || options.max_time >= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x135);
  }
  if (0.0 <= options.max_time) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < *(int *)initial_seed - 1U) {
    assertion_failed("root_state.player_to_move == 1 || root_state.player_to_move == 2",
                     "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/mcts.h"
                     ,0x13c);
  }
  this = (Node<ConnectFourState> *)operator_new(0x60);
  Node<ConnectFourState>::Node(this,(ConnectFourState *)initial_seed);
  *(Node<ConnectFourState> **)root_state = this;
  ConnectFourState::ConnectFourState(&state,6,7);
  iVar2 = 1;
  do {
    if (iVar2 == options.max_iterations + 1) {
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&state.board);
      return (__uniq_ptr_data<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>,_true,_true>
              )(__uniq_ptr_data<MCTS::Node<ConnectFourState>,_std::default_delete<MCTS::Node<ConnectFourState>_>,_true,_true>
                )root_state;
    }
    ConnectFourState::operator=(&state,(ConnectFourState *)initial_seed);
    this_00 = this;
    while ((this_00->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this_00->moves).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      if ((this_00->children).
          super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this_00->children).
          super__Vector_base<MCTS::Node<ConnectFourState>_*,_std::allocator<MCTS::Node<ConnectFourState>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00110d21;
      this_00 = Node<ConnectFourState>::select_child_UCT(this_00);
      ConnectFourState::do_move(&state,this_00->move);
    }
    move = Node<ConnectFourState>::
           get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     (this_00,&random_engine);
    ConnectFourState::do_move(&state,move);
    this_00 = Node<ConnectFourState>::add_child(this_00,&move,&state);
LAB_00110d21:
    while( true ) {
      bVar1 = ConnectFourState::has_moves(&state);
      if (!bVar1) break;
      ConnectFourState::
      do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                (&state,&random_engine);
    }
    for (; this_00 != (Node<ConnectFourState> *)0x0; this_00 = this_00->parent) {
      dVar3 = ConnectFourState::get_result(&state,this_00->player_to_move);
      this_00->visits = this_00->visits + 1;
      this_00->wins = dVar3 + this_00->wins;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}